

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O2

void cmListFileLexerDestroy(cmListFileLexer *lexer)

{
  cmListFileLexerSetToken(lexer,(char *)0x0,0);
  if ((lexer->file != (FILE *)0x0) || (lexer->string_buffer != (char *)0x0)) {
    cmListFileLexer_yylex_destroy(lexer->scanner);
    if ((FILE *)lexer->file != (FILE *)0x0) {
      fclose((FILE *)lexer->file);
      lexer->file = (FILE *)0x0;
    }
    if (lexer->string_buffer != (char *)0x0) {
      free(lexer->string_buffer);
      lexer->string_buffer = (char *)0x0;
      lexer->string_position = (char *)0x0;
      lexer->string_left = 0;
    }
  }
  return;
}

Assistant:

static void cmListFileLexerDestroy(cmListFileLexer* lexer)
{
  cmListFileLexerSetToken(lexer, 0, 0);
  if (lexer->file || lexer->string_buffer) {
    cmListFileLexer_yylex_destroy(lexer->scanner);
    if (lexer->file) {
      fclose(lexer->file);
      lexer->file = 0;
    }
    if (lexer->string_buffer) {
      free(lexer->string_buffer);
      lexer->string_buffer = 0;
      lexer->string_left = 0;
      lexer->string_position = 0;
    }
  }
}